

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_context_enumerate_devices__jack
                    (ma_context *pContext,ma_enum_devices_callback_proc callback,void *pUserData)

{
  ma_bool32 mVar1;
  long lVar2;
  char cVar3;
  ma_device_info deviceInfo;
  ma_device_info mStack_248;
  
  if (pContext == (ma_context *)0x0) {
    __assert_fail("pContext != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x50bd,
                  "ma_result ma_context_enumerate_devices__jack(ma_context *, ma_enum_devices_callback_proc, void *)"
                 );
  }
  if (callback != (ma_enum_devices_callback_proc)0x0) {
    memset(&mStack_248,0,0x230);
    cVar3 = 'D';
    lVar2 = -0x17;
    do {
      mStack_248.name[lVar2 + 0x17] = cVar3;
      cVar3 = "Failed to create worker thread."[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0);
    mStack_248.name[0x17] = '\0';
    mVar1 = (*callback)(pContext,ma_device_type_playback,&mStack_248,pUserData);
    if (mVar1 != 0) {
      memset(&mStack_248,0,0x230);
      cVar3 = 'D';
      lVar2 = -0x16;
      do {
        mStack_248.name[lVar2 + 0x16] = cVar3;
        cVar3 = "Default Playback Device"[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0);
      mStack_248.name[0x16] = '\0';
      (*callback)(pContext,ma_device_type_capture,&mStack_248,pUserData);
    }
    return 0;
  }
  __assert_fail("callback != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                ,0x50be,
                "ma_result ma_context_enumerate_devices__jack(ma_context *, ma_enum_devices_callback_proc, void *)"
               );
}

Assistant:

static ma_result ma_context_enumerate_devices__jack(ma_context* pContext, ma_enum_devices_callback_proc callback, void* pUserData)
{
    ma_bool32 cbResult = MA_TRUE;

    MA_ASSERT(pContext != NULL);
    MA_ASSERT(callback != NULL);

    /* Playback. */
    if (cbResult) {
        ma_device_info deviceInfo;
        MA_ZERO_OBJECT(&deviceInfo);
        ma_strncpy_s(deviceInfo.name, sizeof(deviceInfo.name), MA_DEFAULT_PLAYBACK_DEVICE_NAME, (size_t)-1);
        cbResult = callback(pContext, ma_device_type_playback, &deviceInfo, pUserData);
    }

    /* Capture. */
    if (cbResult) {
        ma_device_info deviceInfo;
        MA_ZERO_OBJECT(&deviceInfo);
        ma_strncpy_s(deviceInfo.name, sizeof(deviceInfo.name), MA_DEFAULT_CAPTURE_DEVICE_NAME, (size_t)-1);
        cbResult = callback(pContext, ma_device_type_capture, &deviceInfo, pUserData);
    }

    return MA_SUCCESS;
}